

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O1

bool __thiscall
Shell::Options::ChoiceOptionValue<Shell::Options::SplittingLiteralPolarityAdvice>::setValue
          (ChoiceOptionValue<Shell::Options::SplittingLiteralPolarityAdvice> *this,string *value)

{
  int iVar1;
  char *__s;
  long in_RDI;
  int index;
  allocator<char> local_66 [6];
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  string local_40 [32];
  
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,local_66);
  iVar1 = OptionChoiceValues::find
                    ((OptionChoiceValues *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(local_66);
  if (-1 < iVar1) {
    *(int *)(in_RDI + 0x98) = iVar1;
  }
  return -1 < iVar1;
}

Assistant:

bool setValue(const std::string& value){
            // makes reasonable assumption about ordering of every enum
            int index = choices.find(value.c_str());
            if(index<0) return false;
            this->actualValue = static_cast<T>(index);
            return true;
        }